

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcDataStream::add_abs_fixup(CTcDataStream *this,CTcAbsFixup **list_head)

{
  ulong uVar1;
  CTcAbsFixup *pCVar2;
  
  uVar1 = this->ofs_;
  pCVar2 = (CTcAbsFixup *)CTcPrsMem::alloc(G_prsmem,0x18);
  pCVar2->ds = this;
  pCVar2->ofs = uVar1;
  pCVar2->nxt = *list_head;
  *list_head = pCVar2;
  return;
}

Assistant:

void CTcDataStream::add_abs_fixup(CTcAbsFixup **list_head)
{
    /* add the fixup to the list at my current write location */
    CTcAbsFixup::add_abs_fixup(list_head, this, get_ofs());
}